

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_cpp_struct(t_cpp_generator *this,t_struct *tstruct,bool is_exception)

{
  ofstream_with_content_based_conditional_update *out;
  bool bVar1;
  ofstream_with_content_based_conditional_update *out_00;
  
  generate_struct_declaration
            (this,(ostream *)&this->f_types_,tstruct,is_exception,false,true,true,true,true);
  out = &this->f_types_impl_;
  generate_struct_definition(this,(ostream *)out,(ostream *)out,tstruct,true,true);
  out_00 = &this->f_types_tcc_;
  if (this->gen_templates_ == false) {
    out_00 = out;
  }
  generate_struct_reader(this,(ostream *)out_00,tstruct,false);
  generate_struct_writer(this,(ostream *)out_00,tstruct,false);
  generate_struct_swap(this,(ostream *)out,tstruct);
  generate_constructor_helper(this,(ostream *)out,tstruct,is_exception,false);
  if (this->gen_moveable_ == true) {
    generate_constructor_helper(this,(ostream *)out,tstruct,is_exception,true);
  }
  generate_assignment_helper(this,(ostream *)out,tstruct,false);
  if (this->gen_moveable_ == true) {
    generate_assignment_helper(this,(ostream *)out,tstruct,true);
  }
  bVar1 = has_custom_ostream(this,&tstruct->super_t_type);
  if (!bVar1) {
    generate_struct_print_method(this,(ostream *)out,tstruct);
  }
  if (is_exception) {
    generate_exception_what_method(this,(ostream *)out,tstruct);
  }
  this->has_members_ = true;
  return;
}

Assistant:

void t_cpp_generator::generate_cpp_struct(t_struct* tstruct, bool is_exception) {
  generate_struct_declaration(f_types_, tstruct, is_exception, false, true, true, true, true);
  generate_struct_definition(f_types_impl_, f_types_impl_, tstruct, true, true);

  std::ostream& out = (gen_templates_ ? f_types_tcc_ : f_types_impl_);
  generate_struct_reader(out, tstruct);
  generate_struct_writer(out, tstruct);
  generate_struct_swap(f_types_impl_, tstruct);
  generate_copy_constructor(f_types_impl_, tstruct, is_exception);
  if (gen_moveable_) {
    generate_move_constructor(f_types_impl_, tstruct, is_exception);
  }
  generate_assignment_operator(f_types_impl_, tstruct);
  if (gen_moveable_) {
    generate_move_assignment_operator(f_types_impl_, tstruct);
  }

  if (!has_custom_ostream(tstruct)) {
    generate_struct_print_method(f_types_impl_, tstruct);
  }

  if (is_exception) {
    generate_exception_what_method(f_types_impl_, tstruct);
  }

  has_members_ = true;
}